

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11CachePolicyULT.cpp
# Opt level: O0

void __thiscall CTestGen11CachePolicy::CheckL3CachePolicy(CTestGen11CachePolicy *this)

{
  bool bVar1;
  undefined8 uVar2;
  Message *pMVar3;
  char *pcVar4;
  AssertHelper local_1f8;
  Message local_1f0;
  ushort local_1e2;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  Message local_1c8;
  ushort local_1ba;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_8;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_7;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_6;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  ushort local_ce;
  unsigned_short local_cc [2];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  ushort local_a6;
  unsigned_short local_a4 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88 [3];
  ushort local_6e;
  unsigned_short local_6c [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ushort uStack_50;
  GMM_CACHE_POLICY_TBL_ELEMENT Mocs;
  uint32_t AssignedMocsIdx;
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint local_18;
  uint32_t Usage;
  uint32_t L3_UNCACHEABLE;
  uint32_t L3_WB_CACHEABLE;
  CTestGen11CachePolicy *this_local;
  
  Usage = 3;
  local_18 = 1;
  _L3_UNCACHEABLE = this;
  for (ClientRequest.IsOverridenByRegkey = 0; ClientRequest.IsOverridenByRegkey < 0x11e;
      ClientRequest.IsOverridenByRegkey = ClientRequest.IsOverridenByRegkey + 1) {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (&Mocs.L3,CommonULT::pGmmULTClientContext,ClientRequest.IsOverridenByRegkey);
    Mocs.LeCC.DwordValue = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    uVar2 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
                      (CommonULT::pGmmULTClientContext,Mocs.LeCC.DwordValue);
    local_6c[0] = 0;
    local_6c[1] = 0;
    uStack_50 = (ushort)((ulong)uVar2 >> 0x20);
    local_6e = uStack_50 & 1;
    unique0x10001047 = uVar2;
    testing::internal::EqHelper<true>::Compare<int,unsigned_short>
              ((char *)local_68,"0",(int *)"Mocs.L3.ESC",local_6c,&local_6e);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(local_88);
      pMVar3 = testing::Message::operator<<(local_88,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [18])": ESC is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x49,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    local_a4[0] = 0;
    local_a4[1] = 0;
    local_a6 = uStack_50 >> 1 & 7;
    testing::internal::EqHelper<true>::Compare<int,unsigned_short>
              ((char *)local_a0,"0",(int *)"Mocs.L3.SCC",local_a4,&local_a6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pMVar3 = testing::Message::operator<<(&local_b0,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [18])": SCC is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    local_cc[0] = 0;
    local_cc[1] = 0;
    local_ce = (ushort)uStack_50._1_1_;
    testing::internal::EqHelper<true>::Compare<int,unsigned_short>
              ((char *)local_c8,"0",(int *)"Mocs.L3.Reserved",local_cc,&local_ce);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pMVar3 = testing::Message::operator<<(&local_d8,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [29])0x228425);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x4b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    local_f4 = 0x40;
    testing::internal::CmpHelperGT<int,unsigned_int>
              ((internal *)local_f0,"(64)","AssignedMocsIdx",&local_f4,(uint *)&Mocs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pMVar3 = testing::Message::operator<<(&local_100,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<
                         (pMVar3,(char (*) [43])": MOCS Index greater than MAX allowed (62)");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x4e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (((ulong)ClientRequest._0_8_ >> 0x12 & 1) == 0) {
      if (ClientRequest.IsOverridenByRegkey == 0x39) {
        local_144 = 0x3e;
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  ((EqHelper<false> *)local_140,"AssignedMocsIdx","62",(uint *)&Mocs,&local_144);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
        if (!bVar1) {
          testing::Message::Message(&local_150);
          pMVar3 = testing::Message::operator<<(&local_150,(char (*) [8])"Usage# ");
          pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(char (*) [35])": Incorrect Index for MOCS62 usage");
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                     ,0x59,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_150);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      }
      else if (ClientRequest.IsOverridenByRegkey == 0x3a) {
        local_16c = 0x3f;
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  ((EqHelper<false> *)local_168,"AssignedMocsIdx","63",(uint *)&Mocs,&local_16c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          pMVar3 = testing::Message::operator<<(&local_178,(char (*) [8])"Usage# ");
          pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(char (*) [35])": Incorrect Index for MOCS63 usage");
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                     ,0x5d,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      }
      else {
        local_194 = 0x30;
        testing::internal::CmpHelperLT<unsigned_int,int>
                  ((internal *)local_190,"AssignedMocsIdx","(48)",(uint *)&Mocs,&local_194);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
        if (!bVar1) {
          testing::Message::Message(&local_1a0);
          pMVar3 = testing::Message::operator<<(&local_1a0,(char (*) [8])"Usage# ");
          pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(char (*) [36])": Incorrect Index for HDCL1 setting");
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                     ,0x61,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_1a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      }
    }
    else {
      local_11c = 0x30;
      testing::internal::CmpHelperGE<unsigned_int,int>
                ((internal *)local_118,"AssignedMocsIdx","(48)",(uint *)&Mocs,&local_11c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        pMVar3 = testing::Message::operator<<(&local_128,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [36])": Incorrect Index for HDCL1 setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                   ,0x53,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    }
    if (((ulong)ClientRequest._0_8_ >> 2 & 1) == 0) {
      local_1e2 = uStack_50 >> 4 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_short>
                ((EqHelper<false> *)local_1e0,"L3_UNCACHEABLE","Mocs.L3.Cacheability",&local_18,
                 &local_1e2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1f0);
        pMVar3 = testing::Message::operator<<(&local_1f0,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [35])": Incorrect L3 cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                   ,0x6b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1f8,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message(&local_1f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    }
    else {
      local_1ba = uStack_50 >> 4 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_short>
                ((EqHelper<false> *)local_1b8,"L3_WB_CACHEABLE","Mocs.L3.Cacheability",&Usage,
                 &local_1ba);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pMVar3 = testing::Message::operator<<(&local_1c8,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [35])": Incorrect L3 cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                   ,0x67,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_1c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    }
  }
  return;
}

Assistant:

void CTestGen11CachePolicy::CheckL3CachePolicy()
{
    const uint32_t L3_WB_CACHEABLE = 0x3;
    const uint32_t L3_UNCACHEABLE  = 0x1;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                     AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen11.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        EXPECT_EQ(0, Mocs.L3.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.L3.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        EXPECT_EQ(0, Mocs.L3.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check if Mocs Index is not greater than GMM_GEN9_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_MAX_NUMBER_MOCS_INDEXES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (62)";

        // Check of assigned Index setting is appropriate for HDCL1 setting
        if(ClientRequest.HDCL1)
        {
            EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }
        else
        {
            if(Usage == GMM_RESOURCE_USAGE_MOCS_62)
            {
                EXPECT_EQ(AssignedMocsIdx, 62) << "Usage# " << Usage << ": Incorrect Index for MOCS62 usage";
            }
            else if(Usage == GMM_RESOURCE_USAGE_L3_EVICTION)
            {
                EXPECT_EQ(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for MOCS63 usage";
            }
            else
            {
                EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
            }
        }

        if(ClientRequest.L3)
        {
            EXPECT_EQ(L3_WB_CACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }
        else
        {
            EXPECT_EQ(L3_UNCACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }
    }
}